

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::DefaultGlobalTestPartResultReporter::ReportTestPartResult
          (DefaultGlobalTestPartResultReporter *this,TestPartResult *result)

{
  TestEventListeners *this_00;
  TestEventListener *pTVar1;
  TestResult *in_RSI;
  TestPartResult *in_RDI;
  
  UnitTestImpl::current_test_result(*(UnitTestImpl **)&in_RDI->file_name_);
  TestResult::AddTestPartResult(in_RSI,in_RDI);
  this_00 = UnitTestImpl::listeners(*(UnitTestImpl **)&in_RDI->file_name_);
  pTVar1 = TestEventListeners::repeater(this_00);
  (*pTVar1->_vptr_TestEventListener[8])(pTVar1,in_RSI);
  return;
}

Assistant:

void DefaultGlobalTestPartResultReporter::ReportTestPartResult(
    const TestPartResult& result) {
  unit_test_->current_test_result()->AddTestPartResult(result);
  unit_test_->listeners()->repeater()->OnTestPartResult(result);
}